

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateScaleLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RepeatedField<unsigned_long> *pRVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  string *psVar8;
  uint64_t outChannels;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  char cVar12;
  bool bVar13;
  LayerUnion LVar14;
  undefined8 *puVar15;
  unsigned_long *puVar16;
  long *plVar17;
  uint uVar18;
  WeightParams *pWVar19;
  size_type *psVar20;
  ulong *puVar21;
  char cVar22;
  ulong uVar23;
  undefined8 uVar24;
  _Alloc_hider _Var25;
  uint64_t uVar26;
  uint uVar27;
  uint __len;
  string err;
  Result r;
  string err_2;
  string local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  undefined1 local_d8 [24];
  string local_c0;
  string local_a0;
  WeightParams *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  unsigned_long local_58;
  string local_50;
  
  Result::Result((Result *)&local_110);
  validateInputCount((Result *)local_e8,layer,1,1);
  local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8;
  std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
  if (local_e0._M_p != local_d8 + 8) {
    operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
  }
  bVar11 = Result::good((Result *)&local_110);
  if (bVar11) {
    validateOutputCount((Result *)local_e8,layer,1,1);
    local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8;
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
    if (local_e0._M_p != local_d8 + 8) {
      operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
    }
  }
  bVar11 = Result::good((Result *)&local_110);
  if (bVar11) {
    if (this->ndArrayInterpretation != true) {
LAB_0053fbd2:
      if (layer->_oneof_case_[0] == 0xf5) {
        LVar14 = layer->layer_;
      }
      else {
        LVar14.scale_ = Specification::ScaleLayerParams::default_instance();
      }
      pWVar19 = (LVar14.scale_)->scale_;
      if (pWVar19 == (WeightParams *)0x0) {
        pWVar19 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar4 = (pWVar19->floatvalue_).current_size_;
      sVar5 = ((pWVar19->float16value_).ptr_)->_M_string_length;
      uVar27 = (0 < iVar4) + 1;
      if (sVar5 == 0) {
        uVar27 = (uint)(0 < iVar4);
      }
      sVar6 = ((pWVar19->rawvalue_).ptr_)->_M_string_length;
      sVar7 = ((pWVar19->int8rawvalue_).ptr_)->_M_string_length;
      uVar9 = (uint)(sVar7 == 0);
      uVar27 = (uVar27 - (sVar6 == 0)) + 2;
      cVar12 = '\x04';
      if (uVar27 - uVar9 < 2) {
        cVar12 = '\x05';
        if (uVar27 != uVar9) {
          cVar12 = iVar4 < 1;
        }
        if (((((sVar5 == 0) && (iVar4 < 1)) && (uVar27 != uVar9)) &&
            (((sVar6 == 0 ||
              (pWVar19 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar12 = '\x02', pWVar19->quantization_ == (QuantizationParams *)0x0)))) &&
           (((sVar7 == 0 ||
             (pWVar19 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
            (cVar12 = '\x03', pWVar19->quantization_ == (QuantizationParams *)0x0)))) {
          cVar12 = '\x05';
        }
      }
      pWVar19 = (LVar14.scale_)->bias_;
      if (pWVar19 == (WeightParams *)0x0) {
        pWVar19 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      iVar4 = (pWVar19->floatvalue_).current_size_;
      sVar5 = ((pWVar19->float16value_).ptr_)->_M_string_length;
      uVar27 = (0 < iVar4) + 1;
      if (sVar5 == 0) {
        uVar27 = (uint)(0 < iVar4);
      }
      sVar6 = ((pWVar19->rawvalue_).ptr_)->_M_string_length;
      sVar7 = ((pWVar19->int8rawvalue_).ptr_)->_M_string_length;
      uVar9 = (uint)(sVar7 == 0);
      uVar27 = (uVar27 - (sVar6 == 0)) + 2;
      cVar22 = '\x04';
      if (uVar27 - uVar9 < 2) {
        cVar22 = '\x05';
        if (uVar27 != uVar9) {
          cVar22 = iVar4 < 1;
        }
        if (((((sVar5 == 0) && (iVar4 < 1)) && (uVar27 != uVar9)) &&
            (((sVar6 == 0 ||
              (pWVar19 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
             (cVar22 = '\x02', pWVar19->quantization_ == (QuantizationParams *)0x0)))) &&
           (((sVar7 == 0 ||
             (pWVar19 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
            (cVar22 = '\x03', pWVar19->quantization_ == (QuantizationParams *)0x0)))) {
          cVar22 = '\x05';
        }
      }
      if ((cVar12 == '\x04') ||
         (bVar11 = (LVar14.scale_)->hasbias_, (cVar22 == '\x04' & bVar11) != 0)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,"Scale layer \'",(layer->name_).ptr_);
        puVar15 = (undefined8 *)std::__cxx11::string::append(local_e8);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        psVar20 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar20) {
          local_130.field_2._M_allocated_capacity = *psVar20;
          local_130.field_2._8_8_ = puVar15[3];
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar20;
          local_130._M_dataplus._M_p = (pointer)*puVar15;
        }
        local_130._M_string_length = puVar15[1];
        *puVar15 = psVar20;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        if (local_e8 != (undefined1  [8])local_d8) {
          operator_delete((void *)local_e8,local_d8._0_8_ + 1);
        }
        Result::Result((Result *)local_e8,INVALID_MODEL_PARAMETERS,&local_130);
LAB_0054020e:
        local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8;
        std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
        if (local_e0._M_p != local_d8 + 8) {
          operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
        }
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)__return_storage_ptr__ = local_110;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_p == &local_f8) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_f8._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_108._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_100;
        local_100 = 0;
        local_f8._M_local_buf[0] = '\0';
        uVar24 = local_130.field_2._M_allocated_capacity;
        _Var25._M_p = local_130._M_dataplus._M_p;
        local_108._M_p = (pointer)&local_f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_005407ef;
      }
      else {
        if ((bVar11 != false) &&
           (((cVar12 == '\x01' && (cVar22 == '\0')) || ((cVar12 == '\0' && (cVar22 == '\x01')))))) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,"Scale layer \'",(layer->name_).ptr_);
          puVar15 = (undefined8 *)std::__cxx11::string::append(local_e8);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          psVar20 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar20) {
            local_130.field_2._M_allocated_capacity = *psVar20;
            local_130.field_2._8_8_ = puVar15[3];
          }
          else {
            local_130.field_2._M_allocated_capacity = *psVar20;
            local_130._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_130._M_string_length = puVar15[1];
          *puVar15 = psVar20;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          if (local_e8 != (undefined1  [8])local_d8) {
            operator_delete((void *)local_e8,local_d8._0_8_ + 1);
          }
          Result::Result((Result *)local_e8,INVALID_MODEL_PARAMETERS,&local_130);
          goto LAB_0054020e;
        }
        pRVar2 = &(LVar14.convolution_)->kernelsize_;
        if ((((LVar14.convolution_)->kernelsize_).current_size_ | 2U) == 3) {
          uVar27 = 0;
          if (pRVar2->current_size_ < 1) {
            uVar26 = 1;
          }
          else {
            uVar26 = 1;
            do {
              puVar16 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar2,uVar27);
              uVar26 = uVar26 * *puVar16;
              uVar27 = uVar27 + 1;
            } while ((int)uVar27 < pRVar2->current_size_);
            uVar27 = (uint)(pRVar2->current_size_ == 3);
          }
          if (((char)uVar27 == '\0') ||
             (((LVar14.innerproduct_)->bias_->_internal_metadata_).
              super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
              .ptr_ < (void *)0x2)) {
            pWVar19 = (LVar14.scale_)->scale_;
            if (pWVar19 == (WeightParams *)0x0) {
              pWVar19 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Scale","");
            local_80 = (WeightParams *)(layer->name_).ptr_;
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"scale","");
            validateGeneralWeightParams
                      ((Result *)local_e8,pWVar19,uVar26,1,&local_130,(string *)local_80,&local_c0);
          }
          else {
            pWVar19 = (LVar14.scale_)->scale_;
            if (pWVar19 == (WeightParams *)0x0) {
              pWVar19 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            puVar16 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar2,0);
            local_58 = *puVar16;
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            local_80 = pWVar19;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Scale","");
            psVar8 = (layer->name_).ptr_;
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"scale","");
            validateGeneralWeightParams
                      ((Result *)local_e8,local_80,uVar26,local_58,&local_130,psVar8,&local_c0);
          }
          local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8;
          std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
          if (local_e0._M_p != local_d8 + 8) {
            operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          bVar13 = Result::good((Result *)&local_110);
          if (!bVar13) goto LAB_005407a1;
          if (bVar11 == false) {
LAB_00540797:
            Result::Result(__return_storage_ptr__);
            goto LAB_005407ef;
          }
          pRVar2 = &(LVar14.convolution_)->stride_;
          if ((((LVar14.convolution_)->stride_).current_size_ | 2U) == 3) {
            uVar27 = 0;
            if (pRVar2->current_size_ < 1) {
              uVar26 = 1;
            }
            else {
              uVar26 = 1;
              do {
                puVar16 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar2,uVar27);
                uVar26 = uVar26 * *puVar16;
                uVar27 = uVar27 + 1;
              } while ((int)uVar27 < pRVar2->current_size_);
              uVar27 = (uint)(pRVar2->current_size_ == 3);
            }
            if (((char)uVar27 == '\0') ||
               (puVar16 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar2,0),
               *puVar16 < 2)) {
              pWVar19 = (LVar14.scale_)->bias_;
              if (pWVar19 == (WeightParams *)0x0) {
                pWVar19 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Scale","");
              psVar8 = (layer->name_).ptr_;
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"bias","");
              validateGeneralWeightParams
                        ((Result *)local_e8,pWVar19,uVar26,1,&local_130,psVar8,&local_c0);
              local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8;
              std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
              if (local_e0._M_p != local_d8 + 8) {
                operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_0054075d;
            }
            else {
              pWVar19 = (LVar14.scale_)->bias_;
              if (pWVar19 == (WeightParams *)0x0) {
                pWVar19 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              puVar16 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar2,0);
              outChannels = *puVar16;
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Scale","");
              psVar8 = (layer->name_).ptr_;
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"bias","");
              validateGeneralWeightParams
                        ((Result *)local_e8,pWVar19,uVar26,outChannels,&local_130,psVar8,&local_c0);
              local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8;
              std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
              if (local_e0._M_p != local_d8 + 8) {
                operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
LAB_0054075d:
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            bVar11 = Result::good((Result *)&local_110);
            if (!bVar11) goto LAB_005407a1;
            goto LAB_00540797;
          }
          std::operator+(&local_78,"The bias vector for scale layer \'",(layer->name_).ptr_);
          plVar17 = (long *)std::__cxx11::string::append((char *)&local_78);
          puVar21 = (ulong *)(plVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar21) {
            local_c0.field_2._M_allocated_capacity = *puVar21;
            local_c0.field_2._8_8_ = plVar17[3];
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          }
          else {
            local_c0.field_2._M_allocated_capacity = *puVar21;
            local_c0._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_c0._M_string_length = plVar17[1];
          *plVar17 = (long)puVar21;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          std::__cxx11::to_string(&local_a0,pRVar2->current_size_);
          std::operator+(&local_130,&local_c0,&local_a0);
          puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
          psVar20 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar20) {
            local_d8._0_8_ = *psVar20;
            local_d8._8_8_ = puVar15[3];
            local_e8 = (undefined1  [8])local_d8;
          }
          else {
            local_d8._0_8_ = *psVar20;
            local_e8 = (undefined1  [8])*puVar15;
          }
          local_e0._M_p = (pointer)puVar15[1];
          *puVar15 = psVar20;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_e8);
          uVar24 = local_d8._0_8_;
          _Var25._M_p = (pointer)local_e8;
          if (local_e8 == (undefined1  [8])local_d8) goto LAB_005407ef;
        }
        else {
          std::operator+(&local_78,"The shape vector for the scale layer \'",(layer->name_).ptr_);
          plVar17 = (long *)std::__cxx11::string::append((char *)&local_78);
          paVar1 = &local_c0.field_2;
          puVar21 = (ulong *)(plVar17 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar21) {
            local_c0.field_2._M_allocated_capacity = *puVar21;
            local_c0.field_2._8_8_ = plVar17[3];
            local_c0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_c0.field_2._M_allocated_capacity = *puVar21;
            local_c0._M_dataplus._M_p = (pointer)*plVar17;
          }
          local_c0._M_string_length = plVar17[1];
          *plVar17 = (long)puVar21;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          uVar27 = pRVar2->current_size_;
          uVar9 = -uVar27;
          if (0 < (int)uVar27) {
            uVar9 = uVar27;
          }
          __len = 1;
          if (9 < uVar9) {
            uVar23 = (ulong)uVar9;
            uVar10 = 4;
            do {
              __len = uVar10;
              uVar18 = (uint)uVar23;
              if (uVar18 < 100) {
                __len = __len - 2;
                goto LAB_005403a8;
              }
              if (uVar18 < 1000) {
                __len = __len - 1;
                goto LAB_005403a8;
              }
              if (uVar18 < 10000) goto LAB_005403a8;
              uVar23 = uVar23 / 10000;
              uVar10 = __len + 4;
            } while (99999 < uVar18);
            __len = __len + 1;
          }
LAB_005403a8:
          paVar3 = &local_a0.field_2;
          local_a0._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_a0,(char)__len - (char)((int)uVar27 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_a0._M_dataplus._M_p + (uVar27 >> 0x1f),__len,uVar9);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != paVar1) {
            uVar24 = local_c0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_a0._M_string_length + local_c0._M_string_length) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != paVar3) {
              uVar24 = local_a0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < local_a0._M_string_length + local_c0._M_string_length)
            goto LAB_00540432;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0._M_dataplus._M_p);
          }
          else {
LAB_00540432:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_c0,(ulong)local_a0._M_dataplus._M_p);
          }
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          psVar20 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar20) {
            local_130.field_2._M_allocated_capacity = *psVar20;
            local_130.field_2._8_8_ = puVar15[3];
          }
          else {
            local_130.field_2._M_allocated_capacity = *psVar20;
            local_130._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_130._M_string_length = puVar15[1];
          *puVar15 = psVar20;
          puVar15[1] = 0;
          *(undefined1 *)psVar20 = 0;
          puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
          psVar20 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar20) {
            local_d8._0_8_ = *psVar20;
            local_d8._8_8_ = puVar15[3];
            local_e8 = (undefined1  [8])local_d8;
          }
          else {
            local_d8._0_8_ = *psVar20;
            local_e8 = (undefined1  [8])*puVar15;
          }
          local_e0._M_p = (pointer)puVar15[1];
          *puVar15 = psVar20;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != paVar3) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != paVar1) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_e8);
          uVar24 = local_d8._0_8_;
          _Var25._M_p = (pointer)local_e8;
          if (local_e8 == (undefined1  [8])local_d8) goto LAB_005407ef;
        }
      }
      operator_delete(_Var25._M_p,uVar24 + 1);
      goto LAB_005407ef;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Scale","");
    validateInputOutputRankEquality((Result *)local_e8,layer,&local_50,&this->blobNameToRank);
    local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8;
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
    if (local_e0._M_p != local_d8 + 8) {
      operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar11 = Result::good((Result *)&local_110);
    if (bVar11) {
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Scale","");
      validateRankCount((Result *)local_e8,layer,&local_130,3,-1,&this->blobNameToRank);
      local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8;
      std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
      if (local_e0._M_p != local_d8 + 8) {
        operator_delete(local_e0._M_p,local_d8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      bVar11 = Result::good((Result *)&local_110);
      if (bVar11) goto LAB_0053fbd2;
    }
  }
LAB_005407a1:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_110;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p == &local_f8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_f8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_108._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_100;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  local_108._M_p = (pointer)&local_f8;
LAB_005407ef:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,
                    CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateScaleLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Scale", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Scale", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.scale();

    bool has_bias = params.hasbias();
    WeightParamType scaleValueType, biasValueType;
    scaleValueType = valueType(params.scale());
    biasValueType = valueType(params.bias());

    // Check for scale and bias value type. Only float32 or float16 parameters can be populated at any time.
    // Both bias and weights should have the same value types
    if ( (scaleValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Scale layer '" + layer.name() + "' has invalid scale/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((scaleValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (scaleValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            const std::string err = "Scale layer '" + layer.name() +
            "' has invalid scale/bias fields. Field value types should match and should either be half or full precision.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }

    // Checks scale shape and size
    if (!(params.shapescale_size() == 1 || params.shapescale_size() == 3)) { // check shape
        std::string err = "The shape vector for the scale layer '" + layer.name() + "' is " +
        std::to_string(params.shapescale_size()) + " dimensional but should be 1D or 3D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    size_t total_scale_shape = 1;
    for (int i = 0; i < params.shapescale_size(); i++) {
        total_scale_shape *= params.shapescale(i);
    }

    if (params.shapescale_size() == 3 && params.shapescale(0) > 1){
        r = validateGeneralWeightParams(params.scale(), total_scale_shape, params.shapescale(0), "Scale", layer.name(), "scale");
    } else {
        r = validateGeneralWeightParams(params.scale(), total_scale_shape, 1, "Scale", layer.name(), "scale");
    }
    if (!r.good()) return r;

    // Checks bias shape and size
    if (has_bias) {
        if (!(params.shapebias_size() == 1 || params.shapebias_size() == 3)) {
            std::string err = "The bias vector for scale layer '" + layer.name() + "' is " +
            std::to_string(params.shapebias_size()) + " dimensional but should be either 1D or 3D.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        size_t total_bias_shape = 1;
        for (int i = 0; i < params.shapebias_size(); i++) {
            total_bias_shape *= params.shapebias(i);
        }
        if (params.shapebias_size() == 3 && params.shapebias(0) > 1){
            r = validateGeneralWeightParams(params.bias(), total_bias_shape, params.shapebias(0), "Scale", layer.name(), "bias");
        } else {
            r = validateGeneralWeightParams(params.bias(), total_bias_shape, 1, "Scale", layer.name(), "bias");
        }
        if (!r.good()) return r;
    }
    return Result();
}